

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  int *piVar10;
  size_t sVar11;
  size_t sVar12;
  _func_int **pp_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Mat *pMVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  _func_int *p_Var36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  _func_int *p_Var46;
  void *pvVar47;
  int iVar48;
  int iVar49;
  long lVar50;
  int i;
  _func_int **pp_Var51;
  long lVar52;
  long lVar53;
  ulong uVar54;
  int iVar55;
  long lVar56;
  void *pvVar57;
  int y_2;
  ulong uVar58;
  ulong uVar59;
  int y_1;
  void *pvVar60;
  int y;
  ulong uVar61;
  int iVar62;
  ulong uVar63;
  uint uVar64;
  ulong uVar65;
  undefined1 extraout_var [12];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [12];
  float fVar83;
  float fVar84;
  float fVar85;
  v4sf one;
  float fVar86;
  float fVar87;
  float fVar99;
  float fVar100;
  __m128 pos;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar101;
  undefined1 auVar91 [16];
  float fVar88;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  _func_int **local_198;
  undefined1 (*local_178) [16];
  void *local_168;
  ulong local_150;
  undefined1 (*local_128) [16];
  Mat local_c8;
  undefined1 local_78 [16];
  _func_int **local_68;
  Mat *local_60;
  ulong local_58;
  long local_50;
  Option *local_48;
  void *local_40;
  long local_38;
  
  iVar49 = bottom_blob->w;
  iVar6 = bottom_blob->h;
  uVar58 = bottom_blob->elemsize;
  iVar45 = bottom_blob->elempack;
  p_Var36 = this->_vptr_Deconvolution_x86[-3];
  if (opt->use_packing_layout == true) {
    uVar41 = (uint)(((&this->field_0xd0)[(long)p_Var36] & 3) == 0) * 3 + 1;
  }
  else {
    uVar41 = 1;
  }
  iVar42 = (*(int *)(&this->field_0xd4 + (long)p_Var36) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var36);
  iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var36);
  iVar43 = (*(int *)(&this->field_0xd8 + (long)p_Var36) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var36);
  iVar48 = *(int *)(&this->field_0xe8 + (long)p_Var36);
  iVar55 = *(int *)(&this->field_0xfc + (long)p_Var36);
  iVar33 = *(int *)(&this->field_0x100 + (long)p_Var36);
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  p_Var46 = this->_vptr_Deconvolution_x86[-3];
  p_Var36 = (_func_int *)((long)&this->_vptr_Deconvolution_x86 + (long)p_Var46);
  lVar40 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var46) < 1) && (*(int *)(p_Var36 + 0xf0) < 1)) &&
       (*(int *)(p_Var36 + 0xf4) < 1)) && (*(int *)(p_Var36 + 0xf8) < 1)) &&
     ((*(int *)(p_Var36 + 0x104) < 1 || (*(int *)(p_Var36 + 0x108) < 1)))) {
    if (&local_c8 != top_blob) {
      piVar10 = top_blob->refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_c8.data = top_blob->data;
      local_c8.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_c8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_c8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_c8.elempack = top_blob->elempack;
      local_c8.allocator = top_blob->allocator;
      uVar21 = top_blob->dims;
      uVar22 = top_blob->w;
      uVar23 = top_blob->h;
      uVar24 = top_blob->d;
      local_c8.c = top_blob->c;
      local_c8.cstep = top_blob->cstep;
      p_Var46 = this->_vptr_Deconvolution_x86[-3];
      local_c8.dims = uVar21;
      local_c8.w = uVar22;
      local_c8.h = uVar23;
      local_c8.d = uVar24;
    }
    p_Var36 = (_func_int *)((long)&this->_vptr_Deconvolution_x86 + (long)p_Var46);
    lVar40 = 8;
  }
  local_60 = top_blob;
  local_48 = opt;
  Mat::create(&local_c8,iVar55 + (iVar49 + -1) * iVar62 + iVar42 + 1,
              (iVar6 + -1) * iVar48 + iVar43 + iVar33 + 1,*(int *)(p_Var36 + 0xd0) / (int)uVar41,
              (uVar58 / (ulong)(long)iVar45) * (ulong)uVar41,uVar41,
              *(Allocator **)(&opt->lightmode + lVar40));
  auVar66 = _DAT_004c1c20;
  auVar74 = _DAT_004c1bf0;
  auVar73 = _DAT_004c1be0;
  iVar49 = -100;
  if ((local_c8.data != (void *)0x0) && (local_c8.cstep * (long)local_c8.c != 0)) {
    local_68 = this->_vptr_Deconvolution_x86;
    p_Var36 = local_68[-3];
    uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var36);
    local_50 = (long)(int)uVar7;
    uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var36);
    if ((iVar45 == 4) && (uVar41 == 4)) {
      iVar49 = *(int *)(&this->field_0xdc + (long)p_Var36);
      iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var36);
      iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var36);
      iVar48 = *(int *)(&this->field_0xe8 + (long)p_Var36);
      iVar55 = *(int *)(&this->field_0x114 + (long)p_Var36);
      lVar40 = *(long *)(&this->field_0x1a8 + (long)p_Var36);
      uVar65 = 0;
      uVar58 = 0;
      if (0 < (int)uVar7) {
        uVar58 = (ulong)uVar7;
      }
      uVar63 = 0;
      if (0 < (int)uVar8) {
        uVar63 = (ulong)uVar8;
      }
      uVar59 = (ulong)(uint)local_c8.c;
      if (local_c8.c < 1) {
        uVar59 = uVar65;
      }
      fVar83 = (float)DAT_004c1c20;
      fVar84 = DAT_004c1c20._4_4_;
      fVar85 = DAT_004c1c20._8_4_;
      fVar86 = DAT_004c1c20._12_4_;
      for (; uVar65 != uVar59; uVar65 = uVar65 + 1) {
        local_128 = (undefined1 (*) [16])
                    (local_c8.cstep * uVar65 *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                    (long)local_c8.data);
        iVar33 = bottom_blob->w;
        iVar44 = bottom_blob->h;
        uVar38 = 0;
        uVar39 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar39 = uVar38;
        }
        uVar26 = local_c8.w;
        if (local_c8.w < 1) {
          uVar26 = 0;
        }
        uVar30 = local_c8.h;
        if (local_c8.h < 1) {
          uVar30 = 0;
        }
        while (uVar64 = (uint)uVar38, uVar64 != uVar30) {
          iVar34 = (1 - uVar7) * iVar49;
          for (uVar29 = 0; auVar93 = ZEXT816(0), uVar29 != uVar26; uVar29 = uVar29 + 1) {
            if (lVar40 == 0) {
              auVar67 = ZEXT816(0);
            }
            else {
              auVar67 = *(undefined1 (*) [16])(lVar40 + uVar65 * 0x10);
            }
            lVar52 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar65 * (this->weight_data_tm).elemsize + 0x30;
            for (uVar38 = 0; uVar38 != uVar39; uVar38 = uVar38 + 1) {
              pvVar47 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar38 +
                                (long)bottom_blob->data);
              local_78._0_8_ = pvVar47;
              lVar53 = lVar52;
              for (uVar61 = 0; uVar61 != uVar63; uVar61 = uVar61 + 1) {
                iVar27 = (((int)uVar61 - uVar8) + 1) * iVar6 + uVar64;
                if (((-1 < iVar27) && (iVar28 = iVar27 / iVar48, iVar27 % iVar48 == 0)) &&
                   (iVar28 < iVar44)) {
                  lVar56 = (long)iVar28 * (long)bottom_blob->w * bottom_blob->elemsize;
                  iVar27 = iVar34;
                  for (lVar50 = 0; uVar58 * 0x40 != lVar50; lVar50 = lVar50 + 0x40) {
                    if (((-1 < iVar27) && (iVar28 = iVar27 / iVar62, iVar27 % iVar62 == 0)) &&
                       (iVar28 < iVar33)) {
                      lVar37 = (long)(iVar28 << 2);
                      fVar75 = *(float *)((long)pvVar47 + lVar37 * 4 + lVar56);
                      fVar88 = *(float *)((long)pvVar47 + lVar37 * 4 + lVar56 + 4);
                      pfVar2 = (float *)(lVar53 + -0x30 + lVar50);
                      fVar102 = *(float *)((long)pvVar47 + lVar37 * 4 + lVar56 + 8);
                      fVar104 = auVar67._4_4_;
                      fVar105 = auVar67._8_4_;
                      fVar87 = auVar67._12_4_;
                      fVar103 = *(float *)((long)pvVar47 + lVar37 * 4 + lVar56 + 0xc);
                      pfVar3 = (float *)(lVar53 + -0x20 + lVar50);
                      pfVar4 = (float *)(lVar53 + -0x10 + lVar50);
                      pfVar1 = (float *)(lVar53 + lVar50);
                      auVar67._0_4_ =
                           fVar103 * *pfVar1 +
                           fVar102 * *pfVar4 + fVar88 * *pfVar3 + fVar75 * *pfVar2 + auVar67._0_4_;
                      auVar67._4_4_ =
                           fVar103 * pfVar1[1] +
                           fVar102 * pfVar4[1] + fVar88 * pfVar3[1] + fVar75 * pfVar2[1] + fVar104;
                      auVar67._8_4_ =
                           fVar103 * pfVar1[2] +
                           fVar102 * pfVar4[2] + fVar88 * pfVar3[2] + fVar75 * pfVar2[2] + fVar105;
                      auVar67._12_4_ =
                           fVar103 * pfVar1[3] +
                           fVar102 * pfVar4[3] + fVar88 * pfVar3[3] + fVar75 * pfVar2[3] + fVar87;
                    }
                    iVar27 = iVar27 + iVar49;
                  }
                }
                lVar53 = lVar53 + local_50 * 0x40;
              }
              lVar52 = lVar52 + (long)(int)(uVar7 * uVar8 * 0x10) * 4;
            }
            auVar89 = auVar67;
            if (5 < iVar55 - 1U) goto switchD_00277010_caseD_1;
            fVar75 = auVar67._8_4_;
            fVar88 = auVar67._12_4_;
            auVar89 = maxps(auVar67,auVar93);
            switch(iVar55) {
            case 2:
              auVar93 = minps(auVar67,auVar93);
              fVar75 = **(float **)(&this->field_0x118 + (long)p_Var36);
              auVar90._0_4_ = auVar89._0_4_ + fVar75 * auVar93._0_4_;
              auVar90._4_4_ = auVar89._4_4_ + fVar75 * auVar93._4_4_;
              auVar90._8_4_ = auVar89._8_4_ + fVar75 * auVar93._8_4_;
              auVar90._12_4_ = auVar89._12_4_ + fVar75 * auVar93._12_4_;
              auVar89 = auVar90;
              break;
            case 3:
              uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var36);
              uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var36))[1];
              auVar78._4_4_ = uVar9;
              auVar78._0_4_ = uVar9;
              auVar78._8_4_ = uVar9;
              auVar78._12_4_ = uVar9;
              auVar91._4_4_ = uVar5;
              auVar91._0_4_ = uVar5;
              auVar91._8_4_ = uVar5;
              auVar91._12_4_ = uVar5;
              auVar93 = maxps(auVar67,auVar78);
              auVar89 = minps(auVar93,auVar91);
              break;
            case 4:
              auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar68._8_4_ = -fVar75;
              auVar68._12_4_ = -fVar88;
              auVar93 = minps(auVar68,auVar73);
              auVar93 = maxps(auVar93,auVar74);
              fVar88 = auVar93._0_4_ * 1.442695 + 0.5;
              fVar103 = auVar93._4_4_ * 1.442695 + 0.5;
              fVar105 = auVar93._8_4_ * 1.442695 + 0.5;
              fVar99 = auVar93._12_4_ * 1.442695 + 0.5;
              fVar75 = (float)(int)fVar88;
              fVar102 = (float)(int)fVar103;
              fVar104 = (float)(int)fVar105;
              fVar87 = (float)(int)fVar99;
              fVar75 = fVar75 - (float)(-(uint)(fVar88 < fVar75) & (uint)fVar83);
              fVar102 = fVar102 - (float)(-(uint)(fVar103 < fVar102) & (uint)fVar84);
              fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar85);
              fVar87 = fVar87 - (float)(-(uint)(fVar99 < fVar87) & (uint)fVar86);
              fVar88 = fVar75 * -0.6931472 + auVar93._0_4_;
              fVar103 = fVar102 * -0.6931472 + auVar93._4_4_;
              fVar105 = fVar104 * -0.6931472 + auVar93._8_4_;
              fVar99 = fVar87 * -0.6931472 + auVar93._12_4_;
              auVar69._0_4_ = fVar88 * fVar88;
              auVar69._4_4_ = fVar103 * fVar103;
              auVar69._8_4_ = fVar105 * fVar105;
              auVar69._12_4_ = fVar99 * fVar99;
              fVar100 = (float)((int)fVar75 * 0x800000 + (int)fVar83) *
                        (fVar88 + fVar83 +
                        (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88
                          + 0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5) * auVar69._0_4_) +
                        fVar83;
              fVar101 = (float)((int)fVar102 * 0x800000 + (int)fVar84) *
                        (fVar103 + fVar84 +
                        (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                           fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                        auVar69._4_4_) + fVar84;
              fVar104 = (float)((int)fVar104 * 0x800000 + (int)fVar85) *
                        (fVar105 + fVar85 +
                        (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                           fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                        auVar69._8_4_) + fVar85;
              fVar105 = (float)((int)fVar87 * 0x800000 + (int)fVar86) *
                        (fVar99 + fVar86 +
                        (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                          + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * auVar69._12_4_) +
                        fVar86;
              auVar17._4_4_ = fVar101;
              auVar17._0_4_ = fVar100;
              auVar17._8_4_ = fVar104;
              auVar17._12_4_ = fVar105;
              auVar93 = rcpps(auVar69,auVar17);
              fVar75 = auVar93._0_4_;
              fVar88 = auVar93._4_4_;
              fVar102 = auVar93._8_4_;
              fVar103 = auVar93._12_4_;
              auVar89._0_4_ = (fVar83 - fVar100 * fVar75) * fVar75 + fVar75;
              auVar89._4_4_ = (fVar84 - fVar101 * fVar88) * fVar88 + fVar88;
              auVar89._8_4_ = (fVar85 - fVar104 * fVar102) * fVar102 + fVar102;
              auVar89._12_4_ = (fVar86 - fVar105 * fVar103) * fVar103 + fVar103;
              break;
            case 5:
              auVar93 = minps(auVar67,auVar73);
              auVar93 = maxps(auVar93,auVar74);
              fVar102 = auVar93._0_4_ * 1.442695 + 0.5;
              fVar103 = auVar93._4_4_ * 1.442695 + 0.5;
              fVar104 = auVar93._8_4_ * 1.442695 + 0.5;
              fVar105 = auVar93._12_4_ * 1.442695 + 0.5;
              fVar87 = (float)(int)fVar102;
              fVar99 = (float)(int)fVar103;
              fVar100 = (float)(int)fVar104;
              fVar101 = (float)(int)fVar105;
              fVar87 = fVar87 - (float)(-(uint)(fVar102 < fVar87) & (uint)fVar83);
              fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar84);
              fVar100 = fVar100 - (float)(-(uint)(fVar104 < fVar100) & (uint)fVar85);
              fVar101 = fVar101 - (float)(-(uint)(fVar105 < fVar101) & (uint)fVar86);
              fVar102 = auVar93._0_4_ - fVar87 * 0.6931472;
              fVar103 = auVar93._4_4_ - fVar99 * 0.6931472;
              fVar104 = auVar93._8_4_ - fVar100 * 0.6931472;
              fVar105 = auVar93._12_4_ - fVar101 * 0.6931472;
              auVar106._0_4_ =
                   (float)((int)fVar87 * 0x800000 + (int)fVar83) *
                   (fVar102 + fVar83 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) * fVar102 * fVar102) +
                   fVar83;
              auVar106._4_4_ =
                   (float)((int)fVar99 * 0x800000 + (int)fVar84) *
                   (fVar103 + fVar84 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) * fVar103 * fVar103) +
                   fVar84;
              auVar106._8_4_ =
                   (float)((int)fVar100 * 0x800000 + (int)fVar85) *
                   (fVar104 + fVar85 +
                   (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                     0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) * fVar104 * fVar104) +
                   fVar85;
              auVar106._12_4_ =
                   (float)((int)fVar101 * 0x800000 + (int)fVar86) *
                   (fVar105 + fVar86 +
                   (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                     0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105) +
                   fVar86;
              auVar93 = maxps(auVar106,_DAT_004c1c90);
              fVar102 = (float)(auVar93._0_4_ & 0x807fffff | 0x3f000000);
              fVar104 = (float)(auVar93._4_4_ & 0x807fffff | 0x3f000000);
              fVar87 = (float)(auVar93._8_4_ & 0x807fffff | 0x3f000000);
              fVar100 = (float)(auVar93._12_4_ & 0x807fffff | 0x3f000000);
              fVar103 = fVar102 + -1.0 + (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
              fVar105 = fVar104 + -1.0 + (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
              fVar99 = fVar87 + -1.0 + (float)(-(uint)(fVar87 < 0.70710677) & (uint)fVar87);
              fVar101 = fVar100 + -1.0 + (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar100);
              auVar76._0_8_ =
                   CONCAT44(-(uint)(auVar106._4_4_ <= 0.0),-(uint)(auVar106._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar76._8_4_ = -(uint)(auVar106._8_4_ <= 0.0) & 0x7fffffff;
              auVar76._12_4_ = -(uint)(auVar106._12_4_ <= 0.0) & 0x7fffffff;
              auVar14._4_4_ =
                   ~-(uint)(auVar106._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar84)) *
                           DAT_004c1c30._4_4_ + fVar105 +
                          (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) *
                                 fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105 +
                              -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994) *
                            fVar105 + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) * -2.0);
              auVar14._0_4_ =
                   ~-(uint)(auVar106._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar83)) *
                           (float)DAT_004c1c30 + fVar103 +
                          (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                                 fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                              -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                            fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
              auVar14._8_4_ =
                   ~-(uint)(auVar106._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar87 < 0.70710677) & (uint)fVar85)) *
                           DAT_004c1c30._8_4_ + fVar99 +
                          (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 + 0.116769984) *
                                 fVar99 + -0.12420141) * fVar99 + 0.14249323) * fVar99 + -0.16668057
                              ) * fVar99 + 0.20000714) * fVar99 + -0.24999994) * fVar99 + 0.3333333)
                           * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
              auVar14._12_4_ =
                   ~-(uint)(auVar106._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar86)) *
                           DAT_004c1c30._12_4_ + fVar101 +
                          (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) *
                                 fVar101 + -0.12420141) * fVar101 + 0.14249323) * fVar101 +
                              -0.16668057) * fVar101 + 0.20000714) * fVar101 + -0.24999994) *
                            fVar101 + 0.3333333) * fVar101 + -0.5) * fVar101 * fVar101) * -2.0);
              auVar93 = minps(auVar76 | auVar14,auVar73);
              auVar93 = maxps(auVar93,auVar74);
              fVar102 = auVar93._0_4_ * 1.442695 + 0.5;
              fVar103 = auVar93._4_4_ * 1.442695 + 0.5;
              fVar104 = auVar93._8_4_ * 1.442695 + 0.5;
              fVar105 = auVar93._12_4_ * 1.442695 + 0.5;
              fVar87 = (float)(int)fVar102;
              fVar99 = (float)(int)fVar103;
              fVar100 = (float)(int)fVar104;
              fVar101 = (float)(int)fVar105;
              fVar87 = fVar87 - (float)(-(uint)(fVar102 < fVar87) & (uint)fVar83);
              fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar84);
              fVar100 = fVar100 - (float)(-(uint)(fVar104 < fVar100) & (uint)fVar85);
              fVar101 = fVar101 - (float)(-(uint)(fVar105 < fVar101) & (uint)fVar86);
              fVar102 = auVar93._0_4_ - fVar87 * (float)DAT_004c1c30;
              fVar103 = auVar93._4_4_ - fVar99 * DAT_004c1c30._4_4_;
              fVar104 = auVar93._8_4_ - fVar100 * DAT_004c1c30._8_4_;
              fVar105 = auVar93._12_4_ - fVar101 * DAT_004c1c30._12_4_;
              auVar77._0_4_ =
                   fVar102 + fVar83 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) * fVar102 * fVar102;
              auVar77._4_4_ =
                   fVar103 + fVar84 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) * fVar103 * fVar103;
              auVar77._8_4_ =
                   fVar104 + fVar85 +
                   (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                     0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) * fVar104 * fVar104;
              auVar77._12_4_ =
                   fVar105 + fVar86 +
                   (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                     0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105;
              fVar87 = (float)((int)fVar87 * 0x800000 + (int)fVar83) * auVar77._0_4_ + fVar83;
              fVar99 = (float)((int)fVar99 * 0x800000 + (int)fVar84) * auVar77._4_4_ + fVar84;
              fVar100 = (float)((int)fVar100 * 0x800000 + (int)fVar85) * auVar77._8_4_ + fVar85;
              fVar101 = (float)((int)fVar101 * 0x800000 + (int)fVar86) * auVar77._12_4_ + fVar86;
              auVar16._4_4_ = fVar99;
              auVar16._0_4_ = fVar87;
              auVar16._8_4_ = fVar100;
              auVar16._12_4_ = fVar101;
              auVar93 = rcpps(auVar77,auVar16);
              fVar102 = auVar93._0_4_;
              fVar103 = auVar93._4_4_;
              fVar104 = auVar93._8_4_;
              fVar105 = auVar93._12_4_;
              auVar93._0_4_ =
                   fVar102 + fVar102 + -1.0 + (2.0 - fVar87 * (fVar102 + fVar102)) * fVar102;
              auVar93._4_4_ =
                   fVar103 + fVar103 + -1.0 + (2.0 - fVar99 * (fVar103 + fVar103)) * fVar103;
              auVar93._8_4_ =
                   fVar104 + fVar104 + -1.0 + (2.0 - fVar100 * (fVar104 + fVar104)) * fVar104;
              auVar93._12_4_ =
                   fVar105 + fVar105 + -1.0 + (2.0 - fVar101 * (fVar105 + fVar105)) * fVar105;
              goto LAB_00277385;
            case 6:
              fVar102 = **(float **)(&this->field_0x118 + (long)p_Var36);
              fVar103 = (*(float **)(&this->field_0x118 + (long)p_Var36))[1];
              auVar92._0_4_ = fVar102 * auVar67._0_4_ + fVar103;
              auVar92._4_4_ = fVar102 * auVar67._4_4_ + fVar103;
              auVar92._8_4_ = fVar102 * fVar75 + fVar103;
              auVar92._12_4_ = fVar102 * fVar88 + fVar103;
              auVar93 = maxps(auVar92,auVar93);
              auVar93 = minps(auVar93,auVar66);
LAB_00277385:
              auVar89._0_4_ = auVar93._0_4_ * auVar67._0_4_;
              auVar89._4_4_ = auVar93._4_4_ * auVar67._4_4_;
              auVar89._8_4_ = auVar93._8_4_ * fVar75;
              auVar89._12_4_ = auVar93._12_4_ * fVar88;
            }
switchD_00277010_caseD_1:
            *local_128 = auVar89;
            local_128 = local_128 + 1;
            iVar34 = iVar34 + 1;
          }
          uVar38 = (ulong)(uVar64 + 1);
        }
      }
    }
    auVar66 = _DAT_004c1c20;
    auVar74 = _DAT_004c1bf0;
    auVar73 = _DAT_004c1be0;
    if ((iVar45 == 1) && (uVar41 == 4)) {
      p_Var36 = local_68[-3];
      uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var36);
      uVar26 = *(uint *)(&this->field_0xd8 + (long)p_Var36);
      iVar49 = *(int *)(&this->field_0xdc + (long)p_Var36);
      iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var36);
      iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var36);
      iVar48 = *(int *)(&this->field_0xe8 + (long)p_Var36);
      iVar55 = *(int *)(&this->field_0x114 + (long)p_Var36);
      lVar40 = *(long *)(&this->field_0x1a8 + (long)p_Var36);
      uVar65 = 0;
      uVar58 = 0;
      if (0 < (int)uVar7) {
        uVar58 = (ulong)uVar7;
      }
      uVar63 = 0;
      if (0 < (int)uVar26) {
        uVar63 = (ulong)uVar26;
      }
      local_58 = (ulong)(uint)local_c8.c;
      if (local_c8.c < 1) {
        local_58 = uVar65;
      }
      fVar83 = (float)DAT_004c1c20;
      fVar84 = DAT_004c1c20._4_4_;
      fVar85 = DAT_004c1c20._8_4_;
      fVar86 = DAT_004c1c20._12_4_;
      for (; uVar65 != local_58; uVar65 = uVar65 + 1) {
        local_178 = (undefined1 (*) [16])
                    (local_c8.cstep * uVar65 *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                    (long)local_c8.data);
        iVar33 = bottom_blob->w;
        iVar44 = bottom_blob->h;
        local_78._0_4_ = iVar44;
        uVar39 = 0;
        uVar59 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar59 = uVar39;
        }
        uVar30 = local_c8.w;
        if (local_c8.w < 1) {
          uVar30 = 0;
        }
        uVar64 = local_c8.h;
        if (local_c8.h < 1) {
          uVar64 = 0;
        }
        while (uVar29 = (uint)uVar39, uVar29 != uVar64) {
          iVar34 = (1 - uVar7) * iVar49;
          for (uVar32 = 0; auVar93 = ZEXT816(0), uVar32 != uVar30; uVar32 = uVar32 + 1) {
            if (lVar40 == 0) {
              auVar67 = ZEXT816(0);
            }
            else {
              auVar67 = *(undefined1 (*) [16])(lVar40 + uVar65 * 0x10);
            }
            pvVar47 = (void *)((this->weight_data_tm).cstep * uVar65 *
                               (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            for (uVar39 = 0; uVar39 != uVar59; uVar39 = uVar39 + 1) {
              pvVar57 = pvVar47;
              for (uVar38 = 0; uVar38 != uVar63; uVar38 = uVar38 + 1) {
                iVar27 = (((int)uVar38 - uVar26) + 1) * iVar6 + uVar29;
                if (((-1 < iVar27) && (iVar28 = iVar27 / iVar48, iVar27 % iVar48 == 0)) &&
                   (iVar28 < iVar44)) {
                  iVar27 = iVar34;
                  for (lVar52 = 0; uVar58 * 0x10 != lVar52; lVar52 = lVar52 + 0x10) {
                    auVar70 = auVar67;
                    if (((-1 < iVar27) && (iVar31 = iVar27 / iVar62, iVar27 % iVar62 == 0)) &&
                       (iVar31 < iVar33)) {
                      fVar75 = *(float *)((long)bottom_blob->data +
                                         (long)iVar31 * 4 +
                                         (long)iVar28 * (long)bottom_blob->w * bottom_blob->elemsize
                                         + bottom_blob->cstep * bottom_blob->elemsize * uVar39);
                      pfVar1 = (float *)((long)pvVar57 + lVar52);
                      auVar70._0_4_ = auVar67._0_4_ + fVar75 * *pfVar1;
                      auVar70._4_4_ = auVar67._4_4_ + fVar75 * pfVar1[1];
                      auVar70._8_4_ = auVar67._8_4_ + fVar75 * pfVar1[2];
                      auVar70._12_4_ = auVar67._12_4_ + fVar75 * pfVar1[3];
                    }
                    iVar27 = iVar27 + iVar49;
                    auVar67 = auVar70;
                  }
                }
                pvVar57 = (void *)((long)pvVar57 + (long)(int)uVar7 * 0x10);
              }
              pvVar47 = (void *)((long)pvVar47 + (long)(int)(uVar7 * uVar26 * 4) * 4);
            }
            auVar94 = auVar67;
            if (5 < iVar55 - 1U) goto switchD_00277723_caseD_1;
            fVar75 = auVar67._8_4_;
            fVar88 = auVar67._12_4_;
            auVar94 = maxps(auVar67,auVar93);
            switch(iVar55) {
            case 2:
              auVar93 = minps(auVar67,auVar93);
              fVar75 = **(float **)(&this->field_0x118 + (long)p_Var36);
              auVar95._0_4_ = auVar94._0_4_ + fVar75 * auVar93._0_4_;
              auVar95._4_4_ = auVar94._4_4_ + fVar75 * auVar93._4_4_;
              auVar95._8_4_ = auVar94._8_4_ + fVar75 * auVar93._8_4_;
              auVar95._12_4_ = auVar94._12_4_ + fVar75 * auVar93._12_4_;
              auVar94 = auVar95;
              break;
            case 3:
              uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var36);
              uVar5 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var36))[1];
              auVar81._4_4_ = uVar9;
              auVar81._0_4_ = uVar9;
              auVar81._8_4_ = uVar9;
              auVar81._12_4_ = uVar9;
              auVar96._4_4_ = uVar5;
              auVar96._0_4_ = uVar5;
              auVar96._8_4_ = uVar5;
              auVar96._12_4_ = uVar5;
              auVar93 = maxps(auVar67,auVar81);
              auVar94 = minps(auVar93,auVar96);
              break;
            case 4:
              auVar71._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar71._8_4_ = -fVar75;
              auVar71._12_4_ = -fVar88;
              auVar93 = minps(auVar71,auVar73);
              auVar93 = maxps(auVar93,auVar74);
              fVar88 = auVar93._0_4_ * 1.442695 + 0.5;
              fVar103 = auVar93._4_4_ * 1.442695 + 0.5;
              fVar105 = auVar93._8_4_ * 1.442695 + 0.5;
              fVar99 = auVar93._12_4_ * 1.442695 + 0.5;
              fVar75 = (float)(int)fVar88;
              fVar102 = (float)(int)fVar103;
              fVar104 = (float)(int)fVar105;
              fVar87 = (float)(int)fVar99;
              fVar75 = fVar75 - (float)(-(uint)(fVar88 < fVar75) & (uint)fVar83);
              fVar102 = fVar102 - (float)(-(uint)(fVar103 < fVar102) & (uint)fVar84);
              fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar85);
              fVar87 = fVar87 - (float)(-(uint)(fVar99 < fVar87) & (uint)fVar86);
              fVar88 = fVar75 * -0.6931472 + auVar93._0_4_;
              fVar103 = fVar102 * -0.6931472 + auVar93._4_4_;
              fVar105 = fVar104 * -0.6931472 + auVar93._8_4_;
              fVar99 = fVar87 * -0.6931472 + auVar93._12_4_;
              auVar72._0_4_ = fVar88 * fVar88;
              auVar72._4_4_ = fVar103 * fVar103;
              auVar72._8_4_ = fVar105 * fVar105;
              auVar72._12_4_ = fVar99 * fVar99;
              fVar100 = (float)((int)fVar75 * 0x800000 + (int)fVar83) *
                        (fVar88 + fVar83 +
                        (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88
                          + 0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5) * auVar72._0_4_) +
                        fVar83;
              fVar101 = (float)((int)fVar102 * 0x800000 + (int)fVar84) *
                        (fVar103 + fVar84 +
                        (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                           fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                        auVar72._4_4_) + fVar84;
              fVar104 = (float)((int)fVar104 * 0x800000 + (int)fVar85) *
                        (fVar105 + fVar85 +
                        (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                           fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                        auVar72._8_4_) + fVar85;
              fVar105 = (float)((int)fVar87 * 0x800000 + (int)fVar86) *
                        (fVar99 + fVar86 +
                        (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                          + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * auVar72._12_4_) +
                        fVar86;
              auVar19._4_4_ = fVar101;
              auVar19._0_4_ = fVar100;
              auVar19._8_4_ = fVar104;
              auVar19._12_4_ = fVar105;
              auVar93 = rcpps(auVar72,auVar19);
              fVar75 = auVar93._0_4_;
              fVar88 = auVar93._4_4_;
              fVar102 = auVar93._8_4_;
              fVar103 = auVar93._12_4_;
              auVar94._0_4_ = (fVar83 - fVar100 * fVar75) * fVar75 + fVar75;
              auVar94._4_4_ = (fVar84 - fVar101 * fVar88) * fVar88 + fVar88;
              auVar94._8_4_ = (fVar85 - fVar104 * fVar102) * fVar102 + fVar102;
              auVar94._12_4_ = (fVar86 - fVar105 * fVar103) * fVar103 + fVar103;
              break;
            case 5:
              auVar93 = minps(auVar67,auVar73);
              auVar93 = maxps(auVar93,auVar74);
              fVar102 = auVar93._0_4_ * 1.442695 + 0.5;
              fVar103 = auVar93._4_4_ * 1.442695 + 0.5;
              fVar104 = auVar93._8_4_ * 1.442695 + 0.5;
              fVar105 = auVar93._12_4_ * 1.442695 + 0.5;
              fVar87 = (float)(int)fVar102;
              fVar99 = (float)(int)fVar103;
              fVar100 = (float)(int)fVar104;
              fVar101 = (float)(int)fVar105;
              fVar87 = fVar87 - (float)(-(uint)(fVar102 < fVar87) & (uint)fVar83);
              fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar84);
              fVar100 = fVar100 - (float)(-(uint)(fVar104 < fVar100) & (uint)fVar85);
              fVar101 = fVar101 - (float)(-(uint)(fVar105 < fVar101) & (uint)fVar86);
              fVar102 = auVar93._0_4_ - fVar87 * 0.6931472;
              fVar103 = auVar93._4_4_ - fVar99 * 0.6931472;
              fVar104 = auVar93._8_4_ - fVar100 * 0.6931472;
              fVar105 = auVar93._12_4_ - fVar101 * 0.6931472;
              auVar107._0_4_ =
                   (float)((int)fVar87 * 0x800000 + (int)fVar83) *
                   (fVar102 + fVar83 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) * fVar102 * fVar102) +
                   fVar83;
              auVar107._4_4_ =
                   (float)((int)fVar99 * 0x800000 + (int)fVar84) *
                   (fVar103 + fVar84 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) * fVar103 * fVar103) +
                   fVar84;
              auVar107._8_4_ =
                   (float)((int)fVar100 * 0x800000 + (int)fVar85) *
                   (fVar104 + fVar85 +
                   (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                     0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) * fVar104 * fVar104) +
                   fVar85;
              auVar107._12_4_ =
                   (float)((int)fVar101 * 0x800000 + (int)fVar86) *
                   (fVar105 + fVar86 +
                   (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                     0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105) +
                   fVar86;
              auVar93 = maxps(auVar107,_DAT_004c1c90);
              fVar102 = (float)(auVar93._0_4_ & 0x807fffff | 0x3f000000);
              fVar104 = (float)(auVar93._4_4_ & 0x807fffff | 0x3f000000);
              fVar87 = (float)(auVar93._8_4_ & 0x807fffff | 0x3f000000);
              fVar100 = (float)(auVar93._12_4_ & 0x807fffff | 0x3f000000);
              fVar103 = fVar102 + -1.0 + (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
              fVar105 = fVar104 + -1.0 + (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
              fVar99 = fVar87 + -1.0 + (float)(-(uint)(fVar87 < 0.70710677) & (uint)fVar87);
              fVar101 = fVar100 + -1.0 + (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar100);
              auVar79._0_8_ =
                   CONCAT44(-(uint)(auVar107._4_4_ <= 0.0),-(uint)(auVar107._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar79._8_4_ = -(uint)(auVar107._8_4_ <= 0.0) & 0x7fffffff;
              auVar79._12_4_ = -(uint)(auVar107._12_4_ <= 0.0) & 0x7fffffff;
              auVar15._4_4_ =
                   ~-(uint)(auVar107._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar84)) *
                           DAT_004c1c30._4_4_ + fVar105 +
                          (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) *
                                 fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105 +
                              -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994) *
                            fVar105 + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) * -2.0);
              auVar15._0_4_ =
                   ~-(uint)(auVar107._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar83)) *
                           (float)DAT_004c1c30 + fVar103 +
                          (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                                 fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                              -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                            fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
              auVar15._8_4_ =
                   ~-(uint)(auVar107._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar87 < 0.70710677) & (uint)fVar85)) *
                           DAT_004c1c30._8_4_ + fVar99 +
                          (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 + 0.116769984) *
                                 fVar99 + -0.12420141) * fVar99 + 0.14249323) * fVar99 + -0.16668057
                              ) * fVar99 + 0.20000714) * fVar99 + -0.24999994) * fVar99 + 0.3333333)
                           * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
              auVar15._12_4_ =
                   ~-(uint)(auVar107._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar93._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar86)) *
                           DAT_004c1c30._12_4_ + fVar101 +
                          (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984) *
                                 fVar101 + -0.12420141) * fVar101 + 0.14249323) * fVar101 +
                              -0.16668057) * fVar101 + 0.20000714) * fVar101 + -0.24999994) *
                            fVar101 + 0.3333333) * fVar101 + -0.5) * fVar101 * fVar101) * -2.0);
              auVar93 = minps(auVar79 | auVar15,auVar73);
              auVar93 = maxps(auVar93,auVar74);
              fVar102 = auVar93._0_4_ * 1.442695 + 0.5;
              fVar103 = auVar93._4_4_ * 1.442695 + 0.5;
              fVar104 = auVar93._8_4_ * 1.442695 + 0.5;
              fVar105 = auVar93._12_4_ * 1.442695 + 0.5;
              fVar87 = (float)(int)fVar102;
              fVar99 = (float)(int)fVar103;
              fVar100 = (float)(int)fVar104;
              fVar101 = (float)(int)fVar105;
              fVar87 = fVar87 - (float)(-(uint)(fVar102 < fVar87) & (uint)fVar83);
              fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar84);
              fVar100 = fVar100 - (float)(-(uint)(fVar104 < fVar100) & (uint)fVar85);
              fVar101 = fVar101 - (float)(-(uint)(fVar105 < fVar101) & (uint)fVar86);
              fVar102 = auVar93._0_4_ - fVar87 * (float)DAT_004c1c30;
              fVar103 = auVar93._4_4_ - fVar99 * DAT_004c1c30._4_4_;
              fVar104 = auVar93._8_4_ - fVar100 * DAT_004c1c30._8_4_;
              fVar105 = auVar93._12_4_ - fVar101 * DAT_004c1c30._12_4_;
              auVar80._0_4_ =
                   fVar102 + fVar83 +
                   (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
                     0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) * fVar102 * fVar102;
              auVar80._4_4_ =
                   fVar103 + fVar84 +
                   (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103 +
                     0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) * fVar103 * fVar103;
              auVar80._8_4_ =
                   fVar104 + fVar85 +
                   (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104 +
                     0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) * fVar104 * fVar104;
              auVar80._12_4_ =
                   fVar105 + fVar86 +
                   (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105 +
                     0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105;
              fVar87 = (float)((int)fVar87 * 0x800000 + (int)fVar83) * auVar80._0_4_ + fVar83;
              fVar99 = (float)((int)fVar99 * 0x800000 + (int)fVar84) * auVar80._4_4_ + fVar84;
              fVar100 = (float)((int)fVar100 * 0x800000 + (int)fVar85) * auVar80._8_4_ + fVar85;
              fVar101 = (float)((int)fVar101 * 0x800000 + (int)fVar86) * auVar80._12_4_ + fVar86;
              auVar18._4_4_ = fVar99;
              auVar18._0_4_ = fVar87;
              auVar18._8_4_ = fVar100;
              auVar18._12_4_ = fVar101;
              auVar93 = rcpps(auVar80,auVar18);
              fVar102 = auVar93._0_4_;
              fVar103 = auVar93._4_4_;
              fVar104 = auVar93._8_4_;
              fVar105 = auVar93._12_4_;
              auVar98._0_4_ =
                   fVar102 + fVar102 + -1.0 + (2.0 - fVar87 * (fVar102 + fVar102)) * fVar102;
              auVar98._4_4_ =
                   fVar103 + fVar103 + -1.0 + (2.0 - fVar99 * (fVar103 + fVar103)) * fVar103;
              auVar98._8_4_ =
                   fVar104 + fVar104 + -1.0 + (2.0 - fVar100 * (fVar104 + fVar104)) * fVar104;
              auVar98._12_4_ =
                   fVar105 + fVar105 + -1.0 + (2.0 - fVar101 * (fVar105 + fVar105)) * fVar105;
              goto LAB_00277a98;
            case 6:
              fVar102 = **(float **)(&this->field_0x118 + (long)p_Var36);
              fVar103 = (*(float **)(&this->field_0x118 + (long)p_Var36))[1];
              auVar97._0_4_ = fVar102 * auVar67._0_4_ + fVar103;
              auVar97._4_4_ = fVar102 * auVar67._4_4_ + fVar103;
              auVar97._8_4_ = fVar102 * fVar75 + fVar103;
              auVar97._12_4_ = fVar102 * fVar88 + fVar103;
              auVar93 = maxps(auVar97,auVar93);
              auVar98 = minps(auVar93,auVar66);
LAB_00277a98:
              auVar94._0_4_ = auVar98._0_4_ * auVar67._0_4_;
              auVar94._4_4_ = auVar98._4_4_ * auVar67._4_4_;
              auVar94._8_4_ = auVar98._8_4_ * fVar75;
              auVar94._12_4_ = auVar98._12_4_ * fVar88;
            }
switchD_00277723_caseD_1:
            *local_178 = auVar94;
            local_178 = local_178 + 1;
            iVar34 = iVar34 + 1;
          }
          uVar39 = (ulong)(uVar29 + 1);
        }
      }
    }
    if ((iVar45 == 4) && (uVar41 == 1)) {
      p_Var36 = local_68[-3];
      uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var36);
      uVar26 = *(uint *)(&this->field_0xd8 + (long)p_Var36);
      iVar49 = *(int *)(&this->field_0xdc + (long)p_Var36);
      uVar9 = *(undefined4 *)(&this->field_0x114 + (long)p_Var36);
      local_38 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * local_c8.cstep;
      pp_Var51 = (_func_int **)0x0;
      uVar58 = 0;
      if (0 < (int)uVar7) {
        uVar58 = (ulong)uVar7;
      }
      uVar65 = 0;
      if (0 < (int)uVar26) {
        uVar65 = (ulong)uVar26;
      }
      uVar30 = bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar30 = 0;
      }
      uVar64 = local_c8.w;
      if (local_c8.w < 1) {
        uVar64 = 0;
      }
      uVar29 = local_c8.h;
      if (local_c8.h < 1) {
        uVar29 = 0;
      }
      uVar32 = local_c8.c;
      if (local_c8.c < 1) {
        uVar32 = 0;
      }
      local_68 = (_func_int **)(ulong)uVar32;
      local_58 = CONCAT44(local_58._4_4_,(1 - uVar7) * iVar49);
      iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var36);
      iVar62 = *(int *)(&this->field_0xe4 + (long)p_Var36);
      local_78._0_4_ = *(undefined4 *)(&this->field_0xe8 + (long)p_Var36);
      lVar40 = *(long *)(&this->field_0x1a8 + (long)p_Var36);
      local_40 = local_c8.data;
      iVar48 = bottom_blob->w;
      iVar55 = bottom_blob->h;
      for (; pp_Var51 != local_68; pp_Var51 = (_func_int **)((long)pp_Var51 + 1)) {
        local_178 = (undefined1 (*) [16])(local_38 * (long)pp_Var51 + (long)local_40);
        for (uVar32 = 0; uVar32 != uVar29; uVar32 = uVar32 + 1) {
          pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var36);
          sVar11 = (this->weight_data_tm).cstep;
          sVar12 = (this->weight_data_tm).elemsize;
          pvVar47 = (this->weight_data_tm).data;
          local_150 = local_58 & 0xffffffff;
          for (uVar35 = 0; uVar35 != uVar64; uVar35 = uVar35 + 1) {
            if (lVar40 == 0) {
              fVar83 = 0.0;
            }
            else {
              fVar83 = *(float *)(lVar40 + (long)pp_Var51 * 4);
            }
            auVar73 = ZEXT816(0);
            pvVar57 = (void *)(sVar11 * (long)pp_Var51 * sVar12 + (long)pvVar47);
            for (uVar63 = 0; uVar63 != uVar30; uVar63 = uVar63 + 1) {
              pvVar60 = pvVar57;
              for (uVar59 = 0; uVar59 != uVar65; uVar59 = uVar59 + 1) {
                iVar33 = (((int)uVar59 - uVar26) + 1) * iVar6 + uVar32;
                if (-1 < iVar33) {
                  if ((iVar33 % (int)local_78._0_4_ == 0) && (iVar33 / (int)local_78._0_4_ < iVar55)
                     ) {
                    iVar44 = (int)local_150;
                    for (lVar52 = 0; uVar58 * 0x10 != lVar52; lVar52 = lVar52 + 0x10) {
                      auVar74 = auVar73;
                      if (((-1 < iVar44) && (iVar34 = iVar44 / iVar62, iVar44 % iVar62 == 0)) &&
                         (iVar34 < iVar48)) {
                        pfVar2 = (float *)((long)pvVar60 + lVar52);
                        pfVar3 = (float *)((long)bottom_blob->data +
                                          (long)(iVar34 << 2) * 4 +
                                          (long)(iVar33 / (int)local_78._0_4_) *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar63);
                        auVar74._0_4_ = auVar73._0_4_ + *pfVar2 * *pfVar3;
                        auVar74._4_4_ = auVar73._4_4_ + pfVar2[1] * pfVar3[1];
                        auVar74._8_4_ = auVar73._8_4_ + pfVar2[2] * pfVar3[2];
                        auVar74._12_4_ = auVar73._12_4_ + pfVar2[3] * pfVar3[3];
                      }
                      iVar44 = iVar44 + iVar49;
                      auVar73 = auVar74;
                    }
                  }
                }
                pvVar60 = (void *)((long)pvVar60 + (long)(int)uVar7 * 0x10);
              }
              pvVar57 = (void *)((long)pvVar57 + (long)(int)(uVar7 * uVar26 * 4) * 4);
            }
            fVar84 = auVar73._12_4_ + auVar73._4_4_ + fVar83 + auVar73._8_4_ + auVar73._0_4_;
            fVar83 = fVar84;
            switch(uVar9) {
            case 1:
              if (fVar84 <= 0.0) {
                fVar83 = 0.0;
              }
              break;
            case 2:
              fVar83 = (float)(~-(uint)(0.0 < fVar84) & (uint)*pfVar1 |
                              -(uint)(0.0 < fVar84) & 0x3f800000) * fVar84;
              break;
            case 3:
              if (fVar84 <= *pfVar1) {
                fVar84 = *pfVar1;
              }
              fVar83 = pfVar1[1];
              if (fVar84 <= pfVar1[1]) {
                fVar83 = fVar84;
              }
              break;
            case 4:
              if (88.37626 <= fVar84) {
                fVar84 = 88.37626;
              }
              fVar83 = expf((float)(-(uint)(fVar84 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar84 < -88.37626) & (uint)-fVar84));
              fVar83 = 1.0 / (fVar83 + 1.0);
              break;
            case 5:
              fVar83 = expf(fVar84);
              fVar83 = logf(fVar83 + 1.0);
              fVar83 = tanhf(fVar83);
              fVar83 = fVar83 * fVar84;
              break;
            case 6:
              fVar85 = *pfVar1;
              fVar86 = -pfVar1[1] / fVar85;
              fVar83 = 0.0;
              if ((fVar86 <= fVar84) && (fVar83 = fVar84, fVar84 <= fVar86 + 1.0 / fVar85)) {
                fVar83 = (fVar85 * fVar84 + pfVar1[1]) * fVar84;
              }
            }
            *(float *)local_178 = fVar83;
            local_178 = (undefined1 (*) [16])((long)local_178 + 4);
            local_150 = (ulong)((int)local_150 + 1);
          }
        }
      }
    }
    pvVar47 = local_c8.data;
    pp_Var51 = this->_vptr_Deconvolution_x86;
    local_198 = pp_Var51;
    if ((iVar45 == 1) && (uVar41 == 1)) {
      iVar45 = uVar8 * (int)local_50;
      lVar40 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      iVar49 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      lVar52 = (long)local_c8.w;
      uVar65 = 0;
      uVar58 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar58 = uVar65;
      }
      uVar63 = 0;
      if (0 < local_c8.w) {
        uVar63 = (ulong)(uint)local_c8.w;
      }
      uVar59 = (ulong)(uint)local_c8.h;
      if (local_c8.h < 1) {
        uVar59 = uVar65;
      }
      for (; (long)uVar65 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var51[-3]);
          uVar65 = uVar65 + 1) {
        local_168 = (void *)(lVar40 * uVar65 + (long)pvVar47);
        for (iVar62 = 0; iVar62 != (int)uVar59; iVar62 = iVar62 + 1) {
          pp_Var13 = this->_vptr_Deconvolution_x86;
          sVar11 = (this->weight_data_tm).cstep;
          sVar12 = (this->weight_data_tm).elemsize;
          pvVar57 = (this->weight_data_tm).data;
          local_198 = pp_Var13;
          for (uVar39 = 0; uVar39 != uVar63; uVar39 = uVar39 + 1) {
            p_Var36 = pp_Var13[-3];
            if (*(int *)(&this->field_0x10c + (long)p_Var36) == 0) {
              auVar82 = ZEXT812(0);
            }
            else {
              auVar82._4_8_ = 0;
              auVar82._0_4_ = *(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var36) + uVar65 * 4);
            }
            auVar73._12_4_ = 0;
            auVar73._0_12_ = auVar82;
            local_198 = this->_vptr_Deconvolution_x86;
            lVar53 = (long)bottom_blob->w * bottom_blob->elemsize;
            local_78._0_8_ = lVar53;
            pvVar60 = (void *)(sVar11 * uVar65 * sVar12 + (long)pvVar57);
            for (uVar38 = 0; fVar83 = auVar73._0_4_, uVar38 != uVar58; uVar38 = uVar38 + 1) {
              p_Var46 = local_198[-3];
              iVar55 = 0;
              iVar48 = *(int *)(&this->field_0xd8 + (long)p_Var46);
              if (*(int *)(&this->field_0xd8 + (long)p_Var46) < 1) {
                iVar48 = iVar55;
              }
              for (; iVar55 != iVar48; iVar55 = iVar55 + 1) {
                iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var46) * iVar55 + (iVar62 - iVar43);
                if (((-1 < iVar33) &&
                    (iVar44 = iVar33 / *(int *)(&this->field_0xe8 + (long)p_Var46),
                    iVar33 % *(int *)(&this->field_0xe8 + (long)p_Var46) == 0)) && (iVar44 < iVar6))
                {
                  uVar41 = *(uint *)(&this->field_0xd4 + (long)p_Var46);
                  uVar61 = 0;
                  if (0 < (int)uVar41) {
                    uVar61 = (ulong)uVar41;
                  }
                  for (uVar54 = 0; uVar61 != uVar54; uVar54 = uVar54 + 1) {
                    iVar33 = *(int *)(&this->field_0xdc + (long)p_Var46) * (int)uVar54 +
                             ((int)uVar39 - iVar42);
                    if (((-1 < iVar33) &&
                        (iVar34 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var46),
                        iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var46) == 0)) &&
                       (iVar34 < iVar49)) {
                      auVar73._0_4_ =
                           auVar73._0_4_ +
                           *(float *)((long)pvVar60 + uVar54 * 4 + (long)(int)(uVar41 * iVar55) * 4)
                           * *(float *)((long)bottom_blob->data +
                                       (long)iVar34 * 4 +
                                       iVar44 * lVar53 +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar38);
                    }
                  }
                }
              }
              pvVar60 = (void *)((long)pvVar60 + (long)iVar45 * 4);
            }
            auVar66 = auVar73;
            switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var36)) {
            case 1:
              if (fVar83 <= 0.0) {
                auVar20._12_4_ = 0;
                auVar20._0_12_ = auVar73._4_12_;
                auVar66 = auVar20 << 0x20;
              }
              break;
            case 2:
              auVar66 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar83) & 0x3f800000 |
                                              ~-(uint)(0.0 < fVar83) &
                                              **(uint **)(&this->field_0x118 + (long)p_Var36)) *
                                      fVar83));
              break;
            case 3:
              fVar84 = **(float **)(&this->field_0x118 + (long)p_Var36);
              if (fVar83 <= fVar84) {
                auVar73._0_4_ = fVar84;
              }
              fVar83 = (*(float **)(&this->field_0x118 + (long)p_Var36))[1];
              auVar66 = auVar73;
              if (fVar83 < auVar73._0_4_) {
LAB_002783c4:
                auVar66 = ZEXT416((uint)fVar83);
              }
              break;
            case 4:
              if (88.37626 <= fVar83) {
                fVar83 = 88.37626;
              }
              fVar83 = expf((float)(-(uint)(fVar83 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar83 < -88.37626) & (uint)-fVar83));
              auVar66 = ZEXT416((uint)(1.0 / (fVar83 + 1.0)));
              break;
            case 5:
              local_78 = auVar73;
              fVar83 = expf(fVar83);
              fVar83 = logf(fVar83 + 1.0);
              fVar83 = tanhf(fVar83);
              auVar66._0_4_ = fVar83 * (float)local_78._0_4_;
              auVar66._4_12_ = extraout_var;
              break;
            case 6:
              fVar84 = **(float **)(&this->field_0x118 + (long)p_Var36);
              fVar85 = (*(float **)(&this->field_0x118 + (long)p_Var36))[1];
              fVar86 = -fVar85 / fVar84;
              auVar66 = ZEXT816(0);
              if ((fVar86 <= fVar83) && (auVar66 = auVar73, fVar83 <= fVar86 + 1.0 / fVar84)) {
                fVar83 = (fVar84 * fVar83 + fVar85) * fVar83;
                goto LAB_002783c4;
              }
            }
            *(int *)((long)local_168 + uVar39 * 4) = auVar66._0_4_;
          }
          local_168 = (void *)((long)local_168 + lVar52 * 4);
        }
      }
    }
    pMVar25 = local_60;
    Deconvolution::cut_padding
              ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86 + (long)local_198[-3]),
               &local_c8,local_60,local_48);
    if ((pMVar25->data == (void *)0x0) || (iVar49 = 0, (long)pMVar25->c * pMVar25->cstep == 0)) {
      iVar49 = -100;
    }
  }
  piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar49;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}